

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_phys.c
# Opt level: O0

REF_STATUS ref_phys_cc_fv_embed(REF_GRID ref_grid,REF_INT nequ,REF_DBL *flux,REF_DBL *res)

{
  int iVar1;
  REF_NODE ref_node_00;
  REF_CELL ref_cell_00;
  uint uVar2;
  REF_STATUS RVar3;
  REF_DBL *scalar;
  REF_DBL *grad;
  int iVar4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_BOOL high_order;
  REF_DBL *fluxgrad;
  REF_DBL *direqu;
  REF_DBL sdot1;
  REF_DBL sdot0;
  REF_INT node;
  REF_RECON_RECONSTRUCTION recon;
  REF_INT macro;
  REF_INT n1;
  REF_INT n0;
  REF_INT m2n [8] [4];
  REF_DBL macro_xyz [10] [3];
  REF_DBL macro_flux [10];
  REF_DBL *xyzs [4];
  REF_DBL tet_flux [4];
  REF_DBL flux_grad [3];
  REF_DBL cell_vol;
  REF_INT nodes [27];
  int local_54;
  REF_INT cell_edge;
  REF_INT cell_node;
  REF_INT cell;
  REF_INT dir;
  REF_INT equ;
  REF_INT i;
  REF_CELL ref_cell;
  REF_NODE ref_node;
  REF_DBL *res_local;
  REF_DBL *flux_local;
  REF_INT nequ_local;
  REF_GRID ref_grid_local;
  
  ref_node_00 = ref_grid->node;
  ref_cell_00 = ref_grid->cell[8];
  memcpy(&n1,&DAT_002be760,0x80);
  if (ref_grid->node->max < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",0x233,
           "ref_phys_cc_fv_embed","malloc direqu of REF_DBL negative");
    ref_grid_local._4_4_ = 1;
  }
  else {
    scalar = (REF_DBL *)malloc((long)ref_grid->node->max << 3);
    if (scalar == (REF_DBL *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",0x233,
             "ref_phys_cc_fv_embed","malloc direqu of REF_DBL NULL");
      ref_grid_local._4_4_ = 2;
    }
    else if (ref_grid->node->max * 3 < 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",0x234,
             "ref_phys_cc_fv_embed","malloc fluxgrad of REF_DBL negative");
      ref_grid_local._4_4_ = 1;
    }
    else {
      grad = (REF_DBL *)malloc((long)(ref_grid->node->max * 3) << 3);
      if (grad == (REF_DBL *)0x0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",
               0x234,"ref_phys_cc_fv_embed","malloc fluxgrad of REF_DBL NULL");
        ref_grid_local._4_4_ = 2;
      }
      else {
        for (cell_node = 0; cell_node < 3; cell_node = cell_node + 1) {
          for (cell = 0; cell < nequ; cell = cell + 1) {
            for (sdot0._4_4_ = 0; sdot0._4_4_ < ref_node_00->max; sdot0._4_4_ = sdot0._4_4_ + 1) {
              if (((-1 < sdot0._4_4_) && (sdot0._4_4_ < ref_node_00->max)) &&
                 (-1 < ref_node_00->global[sdot0._4_4_])) {
                scalar[sdot0._4_4_] = flux[cell + cell_node * nequ + nequ * 3 * sdot0._4_4_];
              }
            }
            uVar2 = ref_recon_gradient(ref_grid,scalar,grad,REF_RECON_L2PROJECTION);
            if (uVar2 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c"
                     ,0x23b,"ref_phys_cc_fv_embed",(ulong)uVar2,"grad");
              return uVar2;
            }
            for (cell_edge = 0; cell_edge < ref_cell_00->max; cell_edge = cell_edge + 1) {
              RVar3 = ref_cell_nodes(ref_cell_00,cell_edge,(REF_INT *)&cell_vol);
              if (RVar3 == 0) {
                for (local_54 = 0; local_54 < ref_cell_00->node_per; local_54 = local_54 + 1) {
                  for (dir = 0; dir < 3; dir = dir + 1) {
                    macro_xyz[(long)local_54 + -1][(long)dir + 2] =
                         ref_node_00->real[dir + nodes[(long)local_54 + -2] * 0xf];
                  }
                }
                for (nodes[0x1a] = 0; nodes[0x1a] < ref_cell_00->edge_per;
                    nodes[0x1a] = nodes[0x1a] + 1) {
                  iVar4 = nodes[(long)ref_cell_00->e2n[nodes[0x1a] << 1] + -2];
                  iVar1 = nodes[(long)ref_cell_00->e2n[nodes[0x1a] * 2 + 1] + -2];
                  for (dir = 0; dir < 3; dir = dir + 1) {
                    macro_xyz[(long)(nodes[0x1a] + 4) + -1][(long)dir + 2] =
                         (ref_node_00->real[dir + iVar4 * 0xf] +
                         ref_node_00->real[dir + iVar1 * 0xf]) * 0.5;
                  }
                }
                for (local_54 = 0; local_54 < ref_cell_00->node_per; local_54 = local_54 + 1) {
                  macro_flux[(long)local_54 + -1] =
                       flux[cell + cell_node * nequ + nequ * 3 * nodes[(long)local_54 + -2]];
                }
                for (nodes[0x1a] = 0; nodes[0x1a] < ref_cell_00->edge_per;
                    nodes[0x1a] = nodes[0x1a] + 1) {
                  iVar4 = nodes[(long)ref_cell_00->e2n[nodes[0x1a] << 1] + -2];
                  iVar1 = nodes[(long)ref_cell_00->e2n[nodes[0x1a] * 2 + 1] + -2];
                  macro_flux[(long)(nodes[0x1a] + 4) + -1] =
                       (flux[cell + cell_node * nequ + nequ * 3 * iVar4] +
                       flux[cell + cell_node * nequ + nequ * 3 * iVar1]) * 0.5;
                  sdot1 = 0.0;
                  direqu = (REF_DBL *)0x0;
                  for (dir = 0; dir < 3; dir = dir + 1) {
                    sdot1 = (ref_node_00->real[dir + iVar1 * 0xf] -
                            ref_node_00->real[dir + iVar4 * 0xf]) * grad[dir + iVar4 * 3] + sdot1;
                    direqu = (REF_DBL *)
                             ((ref_node_00->real[dir + iVar1 * 0xf] -
                              ref_node_00->real[dir + iVar4 * 0xf]) * grad[dir + iVar1 * 3] +
                             (double)direqu);
                  }
                  macro_flux[(long)(nodes[0x1a] + 4) + -1] =
                       (sdot1 - (double)direqu) * 0.125 + macro_flux[(long)(nodes[0x1a] + 4) + -1];
                }
                for (node = 0; node < 8; node = node + 1) {
                  for (local_54 = 0; local_54 < ref_cell_00->node_per; local_54 = local_54 + 1) {
                    macro_flux[(long)local_54 + 9] =
                         (REF_DBL)(macro_xyz[(long)(&n1)[(long)node * 4 + (long)local_54] + -1] + 2)
                    ;
                    xyzs[(long)local_54 + 3] =
                         (REF_DBL *)macro_flux[(long)(&n1)[(long)node * 4 + (long)local_54] + -1];
                  }
                  uVar2 = ref_node_xyz_vol((REF_DBL **)(macro_flux + 9),flux_grad + 2);
                  if (uVar2 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c"
                           ,0x267,"ref_phys_cc_fv_embed",(ulong)uVar2,"vol");
                    return uVar2;
                  }
                  uVar2 = ref_node_xyz_grad((REF_DBL **)(macro_flux + 9),(REF_DBL *)(xyzs + 3),
                                            tet_flux + 3);
                  if (uVar2 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c"
                           ,0x268,"ref_phys_cc_fv_embed",(ulong)uVar2,"grad");
                    return uVar2;
                  }
                  for (local_54 = 0; local_54 < ref_cell_00->node_per; local_54 = local_54 + 1) {
                    iVar4 = cell + nequ * nodes[(long)local_54 + -2];
                    res[iVar4] = tet_flux[(long)cell_node + 3] * 0.25 * flux_grad[2] + res[iVar4];
                  }
                }
              }
            }
          }
        }
        if (grad != (REF_DBL *)0x0) {
          free(grad);
        }
        if (scalar != (REF_DBL *)0x0) {
          free(scalar);
        }
        ref_grid_local._4_4_ = ref_node_ghost_dbl(ref_node_00,res,nequ);
        if (ref_grid_local._4_4_ == 0) {
          ref_grid_local._4_4_ = 0;
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",
                 0x275,"ref_phys_cc_fv_embed",(ulong)ref_grid_local._4_4_,"ghost res");
        }
      }
    }
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_phys_cc_fv_embed(REF_GRID ref_grid, REF_INT nequ,
                                        REF_DBL *flux, REF_DBL *res) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell = ref_grid_tet(ref_grid);
  REF_INT i, equ, dir, cell, cell_node, cell_edge, nodes[REF_CELL_MAX_SIZE_PER];
  REF_DBL cell_vol, flux_grad[3];
  REF_DBL tet_flux[4], *xyzs[4];
  REF_DBL macro_flux[10], macro_xyz[10][3];
  REF_INT m2n[8][4] = {{0, 4, 5, 6}, {1, 8, 7, 4}, {2, 7, 9, 6}, {3, 6, 9, 8},
                       {4, 6, 9, 5}, {7, 8, 9, 4}, {7, 9, 5, 4}, {8, 6, 9, 4}};
  REF_INT n0, n1, macro;
  REF_RECON_RECONSTRUCTION recon = REF_RECON_L2PROJECTION;
  REF_INT node;
  REF_DBL sdot0, sdot1, *direqu, *fluxgrad;
  REF_BOOL high_order = REF_TRUE;
  /* macro node [edge]
                                  3------9[5]--------2
                                 / \              . /
                                /   \          .   /
                               /     \      .     /
                              /       \  .       /
                             /        .\        /
                          6[2]   5[1]  8[4]   7[3]
                           /    .        \    /
                          /  .            \  /
                         /.                \/
                        0------4[0]--------1
  */

  ref_malloc(direqu, ref_node_max(ref_grid_node(ref_grid)), REF_DBL);
  ref_malloc(fluxgrad, 3 * ref_node_max(ref_grid_node(ref_grid)), REF_DBL);

  for (dir = 0; dir < 3; dir++) {
    for (equ = 0; equ < nequ; equ++) {
      each_ref_node_valid_node(ref_node, node) {
        direqu[node] = flux[equ + dir * nequ + 3 * nequ * node];
      }
      RSS(ref_recon_gradient(ref_grid, direqu, fluxgrad, recon), "grad");
      each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
        each_ref_cell_cell_node(ref_cell, cell_node) {
          for (i = 0; i < 3; i++) {
            macro_xyz[cell_node][i] =
                ref_node_xyz(ref_node, i, nodes[cell_node]);
          }
        }
        each_ref_cell_cell_edge(ref_cell, cell_edge) {
          n0 = nodes[ref_cell_e2n_gen(ref_cell, 0, cell_edge)];
          n1 = nodes[ref_cell_e2n_gen(ref_cell, 1, cell_edge)];
          for (i = 0; i < 3; i++) {
            macro_xyz[4 + cell_edge][i] = 0.5 * (ref_node_xyz(ref_node, i, n0) +
                                                 ref_node_xyz(ref_node, i, n1));
          }
        }

        each_ref_cell_cell_node(ref_cell, cell_node) {
          i = equ + dir * nequ + 3 * nequ * nodes[cell_node];
          macro_flux[cell_node] = flux[i];
        }
        each_ref_cell_cell_edge(ref_cell, cell_edge) {
          n0 = nodes[ref_cell_e2n_gen(ref_cell, 0, cell_edge)];
          n1 = nodes[ref_cell_e2n_gen(ref_cell, 1, cell_edge)];
          macro_flux[4 + cell_edge] =
              0.5 * (flux[equ + dir * nequ + 3 * nequ * n0] +
                     flux[equ + dir * nequ + 3 * nequ * n1]);
          sdot0 = 0.0;
          sdot1 = 0.0;
          for (i = 0; i < 3; i++) {
            sdot0 += (ref_node_xyz(ref_node, i, n1) -
                      ref_node_xyz(ref_node, i, n0)) *
                     fluxgrad[i + 3 * n0];
            sdot1 += (ref_node_xyz(ref_node, i, n1) -
                      ref_node_xyz(ref_node, i, n0)) *
                     fluxgrad[i + 3 * n1];
          }
          if (high_order) macro_flux[4 + cell_edge] += 0.125 * (sdot0 - sdot1);
        }
        for (macro = 0; macro < 8; macro++) {
          each_ref_cell_cell_node(ref_cell, cell_node) {
            xyzs[cell_node] = macro_xyz[m2n[macro][cell_node]];
            tet_flux[cell_node] = macro_flux[m2n[macro][cell_node]];
          }
          RSS(ref_node_xyz_vol(xyzs, &cell_vol), "vol");
          RSS(ref_node_xyz_grad(xyzs, tet_flux, flux_grad), "grad");
          each_ref_cell_cell_node(ref_cell, cell_node) {
            res[equ + nequ * nodes[cell_node]] +=
                0.25 * flux_grad[dir] * cell_vol;
          }
        }
      }
    }
  }

  ref_free(fluxgrad);
  ref_free(direqu);

  RSS(ref_node_ghost_dbl(ref_node, res, nequ), "ghost res");

  return REF_SUCCESS;
}